

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O0

bool __thiscall UdpTools::bindSocketToInterface(UdpTools *this,int sd,string *interfaceName)

{
  int iVar1;
  undefined8 uVar2;
  char local_50 [8];
  ifreq ifr;
  string *interfaceName_local;
  int sd_local;
  UdpTools *this_local;
  
  ifr.ifr_ifru._16_8_ = interfaceName;
  memset(local_50,0,0x28);
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_50,0x10,"%s",uVar2);
  iVar1 = setsockopt(sd,1,0x19,local_50,0x28);
  if (-1 >= iVar1) {
    perror("Server-setsockopt() error for SO_BINDTODEVICE");
  }
  return -1 < iVar1;
}

Assistant:

bool UdpTools::bindSocketToInterface(int sd, std::string interfaceName)
{
	/*Bind socket to a specific interface if set*/
	struct ifreq ifr;
	memset(&ifr, 0, sizeof(ifr));
	snprintf(ifr.ifr_name, sizeof(ifr.ifr_name), "%s", interfaceName.c_str());

	if ((setsockopt(sd, SOL_SOCKET, SO_BINDTODEVICE, (void *)&ifr, sizeof(ifr))) < 0)
	{
		perror("Server-setsockopt() error for SO_BINDTODEVICE");
		return false;
	}
	else
	{
		return true;
	}


}